

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  cmCTest *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_4dc;
  allocator<char> local_4db;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_log;
  string revs;
  string local_460;
  string bzr;
  ostringstream cmCTestLog_msg;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [824];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,
                  "   Gathering version information (one . per revision):\n    ");
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x18a,(char *)err.super_LineParser.super_OutputParser._vptr_OutputParser,false);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
            (&(this->super_cmCTestGlobalVC).Revisions);
  revs._M_dataplus._M_p = (pointer)&revs.field_2;
  revs._M_string_length = 0;
  revs.field_2._M_local_buf[0] = '\0';
  iVar2 = atoi((this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p);
  iVar3 = atoi((this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  if (iVar2 <= iVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   &(this->super_cmCTestGlobalVC).OldRevision,"..");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   &(this->super_cmCTestGlobalVC).NewRevision);
    std::__cxx11::string::operator=((string *)&revs,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::string
              ((string *)&bzr,
               (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
    std::__cxx11::string::string((string *)&cmCTestLog_msg,(string *)&bzr);
    std::__cxx11::string::string<std::allocator<char>>(local_400,"log",(allocator<char> *)&err);
    std::__cxx11::string::string<std::allocator<char>>(local_3e0,"-v",&local_4d9);
    std::__cxx11::string::string<std::allocator<char>>(local_3c0,"-r",&local_4da);
    std::__cxx11::string::string(local_3a0,(string *)&revs);
    std::__cxx11::string::string<std::allocator<char>>(local_380,"--xml",&local_4db);
    std::__cxx11::string::string(local_360,(string *)&this->URL);
    __l._M_len = 7;
    __l._M_array = (iterator)&cmCTestLog_msg;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&bzr_log,__l,&local_4dc);
    lVar4 = 0xc0;
    do {
      std::__cxx11::string::~string((string *)(&cmCTestLog_msg + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    LogParser::LogParser((LogParser *)&cmCTestLog_msg,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    local_460._M_string_length = 0;
    local_460.field_2._M_local_buf[0] = '\0';
    cmCTestVC::RunChild((cmCTestVC *)this,&bzr_log,(OutputParser *)&cmCTestLog_msg,
                        (OutputParser *)&err,&local_460,Auto);
    std::__cxx11::string::~string((string *)&local_460);
    cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
    LogParser::~LogParser((LogParser *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x19f,(char *)err.super_LineParser.super_OutputParser._vptr_OutputParser,false);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bzr_log);
    std::__cxx11::string::~string((string *)&bzr);
  }
  std::__cxx11::string::~string((string *)&revs);
  return true;
}

Assistant:

bool cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if (atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str())) {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
  } else {
    return true;
  }

  // Run "bzr log" to get all global revisions of interest.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_log = { bzr,  "log",   "-v",     "-r",
                                       revs, "--xml", this->URL };
  {
    LogParser out(this, "log-out> ");
    OutputLogger err(this->Log, "log-err> ");
    this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
  return true;
}